

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegStreamReader.cpp
# Opt level: O3

int __thiscall MPEGStreamReader::flushPacket(MPEGStreamReader *this,AVPacket *avPacket)

{
  uint8_t *puVar1;
  long lVar2;
  long lVar3;
  int64_t iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  long lVar8;
  uint8_t *puVar9;
  string message;
  long *local_68;
  long local_60;
  long local_58 [2];
  string local_48;
  
  this->m_eof = true;
  avPacket->codec = (BaseAbstractStreamReader *)this;
  avPacket->duration = 0;
  avPacket->data = (uint8_t *)0x0;
  avPacket->size = 0;
  avPacket->flags = (this->super_AbstractStreamReader).m_flags;
  avPacket->stream_index = (this->super_AbstractStreamReader).m_streamIndex;
  iVar5 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0xd])();
  avPacket->codecID = *(int *)CONCAT44(extraout_var,iVar5);
  lVar8 = (this->super_AbstractStreamReader).m_tmpBufferLen;
  if (0 < lVar8) {
    puVar1 = (this->super_AbstractStreamReader).m_curPos;
    puVar9 = this->m_tmpBuffer;
    (this->super_AbstractStreamReader).m_curPos = puVar9;
    (this->super_AbstractStreamReader).m_bufEnd = puVar9 + lVar8;
    uVar6 = bufFromNAL(this);
    if (uVar6 != 0) {
      this->m_shortStartCodes = uVar6 < 4;
      if (this->m_lastDecodedPos < puVar1 + uVar6) {
        this->m_lastDecodedPos = (uint8_t *)0x0;
        iVar5 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                  _vptr_BaseAbstractStreamReader[0x1f])(this,puVar9 + uVar6);
        if (iVar5 != 0) goto LAB_001bcc44;
        lVar8 = (this->super_AbstractStreamReader).m_tmpBufferLen;
        puVar9 = this->m_tmpBuffer;
      }
    }
    avPacket->data = puVar9;
    avPacket->size = (int32_t)lVar8;
  }
LAB_001bcc44:
  lVar8 = (this->super_AbstractStreamReader).m_timeOffset;
  avPacket->pts = this->m_curPts + lVar8;
  lVar2 = this->m_curDts;
  lVar3 = this->m_pcrIncPerFrame;
  iVar5 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x17])(this);
  avPacket->dts = (lVar8 + lVar2) - iVar5 * lVar3;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Processed ","");
  int32ToStr_abi_cxx11_(&local_48,&this->m_totalFrameNum);
  std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_68);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_68,local_60);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  sLastMsg = true;
  this->m_processedBytes = this->m_processedBytes + (long)avPacket->size;
  iVar4 = (this->super_AbstractStreamReader).m_tmpBufferLen;
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return (int)iVar4;
}

Assistant:

int MPEGStreamReader::flushPacket(AVPacket& avPacket)
{
    m_eof = true;
    avPacket.codec = this;
    avPacket.duration = 0;
    avPacket.data = nullptr;
    avPacket.size = 0;
    avPacket.flags = m_flags;
    avPacket.stream_index = m_streamIndex;
    avPacket.codecID = getCodecInfo().codecID;

    if (m_tmpBufferLen > 0)
    {
        const uint8_t* prevPos = m_curPos;
        m_curPos = m_tmpBuffer;
        m_bufEnd = m_tmpBuffer + m_tmpBufferLen;
        const int isNal = bufFromNAL();
        int decodeRez = 0;
        if (isNal)
        {
            m_shortStartCodes = isNal < 4;
            if ((prevPos + isNal) > m_lastDecodedPos)
            {
                m_lastDecodedPos = nullptr;
                decodeRez = decodeNal(m_curPos + isNal);
            }
        }
        if (decodeRez == 0)
        {
            avPacket.data = m_tmpBuffer;
            avPacket.size = static_cast<int>(m_tmpBufferLen);
        }
    }

    avPacket.pts = m_curPts + m_timeOffset;
    avPacket.dts = m_curDts + m_timeOffset - m_pcrIncPerFrame * getFrameDepth();  // shift dts back

    string message = "Processed ";
    message += int32ToStr(m_totalFrameNum);
    message += " video frames";
    LTRACE(LT_DEBUG, 0, message);
    LTRACE(LT_INFO, 2, message);
    m_processedBytes += avPacket.size;
    return static_cast<int>(m_tmpBufferLen);
}